

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CConnman::ThreadMessageHandler(CConnman *this)

{
  atomic<bool> *paVar1;
  undefined1 *puVar2;
  int iVar3;
  cv_status cVar4;
  long lVar5;
  undefined1 auVar6 [8];
  byte bVar7;
  byte bVar8;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock82;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_68;
  undefined1 local_60 [8];
  bool local_58;
  undefined7 uStack_57;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &NetEventsInterface::g_msgproc_mutex.super_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  if (((this->flagInterruptMsgProc)._M_base._M_i & 1U) == 0) {
    paVar1 = &this->flagInterruptMsgProc;
    do {
      NodesSnapshot::NodesSnapshot((NodesSnapshot *)local_60,this,true);
      puVar2 = (undefined1 *)CONCAT71(uStack_57,local_58);
      bVar8 = 0;
      for (auVar6 = local_60; auVar6 != (undefined1  [8])puVar2;
          auVar6 = (undefined1  [8])
                   ((long)&(((Mutex *)auVar6)->super_mutex).super___mutex_base._M_mutex + 8)) {
        lVar5 = (((Mutex *)auVar6)->super_mutex).super___mutex_base._M_mutex.__align;
        if ((*(byte *)(lVar5 + 0x21a) & 1) == 0) {
          iVar3 = (*this->m_msgproc->_vptr_NetEventsInterface[3])(this->m_msgproc,lVar5,paVar1);
          if ((char)iVar3 == '\0') {
            bVar7 = 0;
          }
          else {
            bVar7 = *(byte *)(lVar5 + 0x241) ^ 1;
          }
          if ((((paVar1->_M_base)._M_i & 1U) != 0) ||
             ((*this->m_msgproc->_vptr_NetEventsInterface[4])(this->m_msgproc,lVar5),
             ((paVar1->_M_base)._M_i & 1U) != 0)) {
            NodesSnapshot::~NodesSnapshot((NodesSnapshot *)local_60);
            goto LAB_008cadef;
          }
          bVar8 = bVar7 | bVar8;
        }
      }
      NodesSnapshot::~NodesSnapshot((NodesSnapshot *)local_60);
      local_58 = false;
      local_60 = (undefined1  [8])&this->mutexMsgProc;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_60);
      if ((bVar8 & 1) == 0) {
        lVar5 = std::chrono::_V2::steady_clock::now();
        local_68.__d.__r = (duration)(lVar5 + 100000000);
        do {
          if (this->fMsgProcWake != false) break;
          cVar4 = std::condition_variable::
                  __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                            (&this->condMsgProc,(unique_lock<std::mutex> *)local_60,&local_68);
        } while (cVar4 != timeout);
      }
      this->fMsgProcWake = false;
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
    } while (((this->flagInterruptMsgProc)._M_base._M_i & 1U) == 0);
  }
LAB_008cadef:
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::ThreadMessageHandler()
{
    LOCK(NetEventsInterface::g_msgproc_mutex);

    while (!flagInterruptMsgProc)
    {
        bool fMoreWork = false;

        {
            // Randomize the order in which we process messages from/to our peers.
            // This prevents attacks in which an attacker exploits having multiple
            // consecutive connections in the m_nodes list.
            const NodesSnapshot snap{*this, /*shuffle=*/true};

            for (CNode* pnode : snap.Nodes()) {
                if (pnode->fDisconnect)
                    continue;

                // Receive messages
                bool fMoreNodeWork = m_msgproc->ProcessMessages(pnode, flagInterruptMsgProc);
                fMoreWork |= (fMoreNodeWork && !pnode->fPauseSend);
                if (flagInterruptMsgProc)
                    return;
                // Send messages
                m_msgproc->SendMessages(pnode);

                if (flagInterruptMsgProc)
                    return;
            }
        }

        WAIT_LOCK(mutexMsgProc, lock);
        if (!fMoreWork) {
            condMsgProc.wait_until(lock, std::chrono::steady_clock::now() + std::chrono::milliseconds(100), [this]() EXCLUSIVE_LOCKS_REQUIRED(mutexMsgProc) { return fMsgProcWake; });
        }
        fMsgProcWake = false;
    }
}